

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::anon_unknown_2::EscapePhpdoc
                   (string *__return_storage_ptr__,string *input)

{
  char cVar1;
  char cVar2;
  size_type i;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  uVar3 = 0;
  cVar2 = '*';
  do {
    if (input->_M_string_length <= uVar3) {
      return __return_storage_ptr__;
    }
    cVar1 = (input->_M_dataplus)._M_p[uVar3];
    if (cVar1 == '@') {
LAB_002b89d9:
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      if (cVar1 == '/') {
        if (cVar2 == '*') goto LAB_002b89d9;
      }
      else if ((cVar1 == '*') && (cVar2 == '/')) goto LAB_002b89d9;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    uVar3 = uVar3 + 1;
    cVar2 = cVar1;
  } while( true );
}

Assistant:

static std::string EscapePhpdoc(const std::string& input) {
  std::string result;
  result.reserve(input.size() * 2);

  char prev = '*';

  for (std::string::size_type i = 0; i < input.size(); i++) {
    char c = input[i];
    switch (c) {
      case '*':
        // Avoid "/*".
        if (prev == '/') {
          result.append("&#42;");
        } else {
          result.push_back(c);
        }
        break;
      case '/':
        // Avoid "*/".
        if (prev == '*') {
          result.append("&#47;");
        } else {
          result.push_back(c);
        }
        break;
      case '@':
        // '@' starts phpdoc tags including the @deprecated tag, which will
        // cause a compile-time error if inserted before a declaration that
        // does not have a corresponding @Deprecated annotation.
        result.append("&#64;");
        break;
      default:
        result.push_back(c);
        break;
    }

    prev = c;
  }

  return result;
}